

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v11::detail::do_format_base2e<char,unsigned_int>
                 (int base_bits,char *out,uint value,int size,bool upper)

{
  uint uVar1;
  char *pcVar2;
  char local_39;
  char *local_38;
  uint digit;
  char *digits;
  bool upper_local;
  int size_local;
  uint value_local;
  char *out_local;
  int base_bits_local;
  
  value_local = value;
  out_local = out + size;
  do {
    if (upper) {
      local_38 = "0123456789ABCDEF";
    }
    else {
      local_38 = "0123456789abcdef";
    }
    uVar1 = value_local & (1 << ((byte)base_bits & 0x1f)) - 1U;
    if (base_bits < 4) {
      local_39 = (char)uVar1 + '0';
    }
    else {
      local_39 = local_38[uVar1];
    }
    pcVar2 = out_local + -1;
    out_local[-1] = local_39;
    value_local = value_local >> ((byte)base_bits & 0x1f);
    out_local = pcVar2;
  } while (value_local != 0);
  return pcVar2;
}

Assistant:

FMT_CONSTEXPR auto do_format_base2e(int base_bits, Char* out, UInt value,
                                    int size, bool upper = false) -> Char* {
  out += size;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << base_bits) - 1));
    *--out = static_cast<Char>(base_bits < 4 ? static_cast<char>('0' + digit)
                                             : digits[digit]);
  } while ((value >>= base_bits) != 0);
  return out;
}